

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void ldamath::vexpdigammify_2(vw *all,float *gamma,float *norm,float underflow_threshold)

{
  v4sf x;
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  bool bVar3;
  undefined8 *puVar4;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar6;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar7 [16];
  v4sf afVar8;
  v4sf vnorm;
  v4sf arg;
  float *fpend;
  float *np;
  float *fp;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  puVar4 = (undefined8 *)((long)in_RSI + (ulong)*(uint *)(in_RDI + 0x3478) * 4);
  local_80 = in_RDX;
  local_78 = in_RSI;
  while( true ) {
    in_stack_ffffffffffffff54 = (float)((uint)in_stack_ffffffffffffff54 & 0xffffff);
    if (local_78 < puVar4) {
      bVar3 = anon_unknown.dwarf_10a8fd::is_aligned16((void *)0x21f178);
      in_stack_ffffffffffffff54 =
           (float)(CONCAT13(bVar3,SUB43(in_stack_ffffffffffffff54,0)) ^ 0xff000000);
    }
    puVar2 = local_78;
    if (((uint)in_stack_ffffffffffffff54 & 0x1000000) == 0) break;
    in_stack_ffffffffffffff50 = in_XMM0_Da;
    fastdigamma(in_stack_ffffffffffffff54);
    fVar5 = fastexp(0.0);
    dVar6 = std::fmax((double)(ulong)(uint)in_stack_ffffffffffffff50,
                      (double)CONCAT44(extraout_XMM0_Db,fVar5));
    *(int *)local_78 = SUB84(dVar6,0);
    local_78 = (undefined8 *)((long)local_78 + 4);
    local_80 = (undefined8 *)((long)local_80 + 4);
  }
  while (local_78 = puVar2, bVar3 = anon_unknown.dwarf_10a8fd::is_aligned16((void *)0x21f1f4),
        bVar3 && local_78 + 2 < puVar4) {
    x[2] = (float)(int)in_stack_ffffffffffffffd8;
    x[3] = (float)(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    x._0_8_ = in_stack_ffffffffffffffd0;
    vfastdigamma(x);
    afVar8[1] = in_stack_ffffffffffffff54;
    afVar8[0] = in_stack_ffffffffffffff50;
    afVar8[2] = (float)(int)*local_80;
    afVar8[3] = (float)((ulong)*local_80 >> 0x20);
    afVar8 = vfastexp(afVar8);
    in_stack_ffffffffffffffd8 = afVar8._0_8_;
    afVar8 = v4sfl(in_XMM0_Da);
    auVar7._8_4_ = (int)extraout_XMM0_Qb_00;
    auVar7._0_8_ = afVar8._0_8_;
    auVar7._12_4_ = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_8_ = in_stack_ffffffffffffffd8;
    auVar7 = maxps(auVar7,auVar1);
    local_98 = auVar7._0_8_;
    uStack_90 = auVar7._8_8_;
    *local_78 = local_98;
    local_78[1] = uStack_90;
    local_80 = local_80 + 2;
    in_stack_ffffffffffffffd0 = local_78;
    puVar2 = local_78 + 2;
  }
  for (; local_78 < puVar4; local_78 = (undefined8 *)((long)local_78 + 4)) {
    fastdigamma(in_stack_ffffffffffffff54);
    fVar5 = fastexp(0.0);
    dVar6 = std::fmax((double)(ulong)(uint)in_XMM0_Da,(double)CONCAT44(extraout_XMM0_Db_00,fVar5));
    *(int *)local_78 = SUB84(dVar6,0);
  }
  return;
}

Assistant:

void vexpdigammify_2(vw &all, float *gamma, const float *norm, const float underflow_threshold)
{
  float *fp = gamma;
  const float *np;
  const float *fpend = gamma + all.lda;

  for (np = norm; fp < fpend && !is_aligned16(fp); ++fp, ++np)
    *fp = fmax(underflow_threshold, fastexp(fastdigamma(*fp) - *np));

  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4, np += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    arg = vfastdigamma(arg);
    v4sf vnorm = _mm_loadu_ps(np);
    arg = arg - vnorm;
    arg = vfastexp(arg);
    arg = _mm_max_ps(v4sfl(underflow_threshold), arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp, ++np) *fp = fmax(underflow_threshold, fastexp(fastdigamma(*fp) - *np));
}